

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::AssertionPortSymbol::AssertionPortSymbol
          (AssertionPortSymbol *this,string_view name,SourceLocation loc)

{
  (this->super_Symbol).kind = AssertionPort;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  DeclaredType::DeclaredType
            (&this->declaredType,&this->super_Symbol,(bitmask<slang::ast::DeclaredTypeFlags>)0x0);
  this->defaultValueSyntax = (PropertyExprSyntax *)0x0;
  (this->localVarDirection).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
  _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged = false;
  return;
}

Assistant:

AssertionPortSymbol::AssertionPortSymbol(string_view name, SourceLocation loc) :
    Symbol(SymbolKind::AssertionPort, name, loc), declaredType(*this) {
}